

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_36::HttpChunkedEntityWriter::write
          (HttpChunkedEntityWriter *this,int __fd,void *__buf,size_t __n)

{
  ArrayPtr<const_unsigned_char> *pAVar1;
  HttpOutputStream *pHVar2;
  char (*params_1) [3];
  uchar *puVar3;
  size_t sVar4;
  undefined4 in_register_00000034;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces;
  Promise<void> promise;
  String header;
  Array<kj::ArrayPtr<const_unsigned_char>_> parts;
  
  if (__n == 0) {
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  }
  else {
    params_1 = (char (*) [3])__n;
    hex((CappedArray<char,_17UL> *)&parts,__n);
    str<kj::CappedArray<char,17ul>,char_const(&)[3]>
              (&header,(kj *)&parts,(CappedArray<char,_17UL> *)0x41da27,params_1);
    pAVar1 = kj::_::HeapArrayDisposer::allocate<kj::ArrayPtr<unsigned_char_const>>(3);
    parts.size_ = 3;
    parts.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    puVar3 = (uchar *)header.content.size_;
    if (header.content.size_ != 0) {
      puVar3 = (uchar *)header.content.ptr;
    }
    sVar4 = 0;
    if (header.content.size_ != 0) {
      sVar4 = header.content.size_ - 1;
    }
    pAVar1->ptr = puVar3;
    pAVar1->size_ = sVar4;
    pAVar1[1].ptr = (uchar *)__buf;
    pAVar1[1].size_ = __n;
    pAVar1[2].ptr =
         "\r\nN2kj1_21AttachmentPromiseNodeINS0_5TupleIJNS_6StringENS_5ArrayINS_8ArrayPtrIKhEEEEEEEEE"
    ;
    pAVar1[2].size_ = 2;
    parts.ptr = pAVar1;
    pHVar2 = HttpEntityBodyWriter::getInner
                       ((HttpEntityBodyWriter *)CONCAT44(in_register_00000034,__fd));
    pieces.size_ = (size_t)pAVar1;
    pieces.ptr = (ArrayPtr<const_unsigned_char> *)pHVar2;
    HttpOutputStream::writeBodyData((HttpOutputStream *)&promise,pieces);
    Promise<void>::attach<kj::String,kj::Array<kj::ArrayPtr<unsigned_char_const>>>
              ((Promise<void> *)this,(String *)&promise,
               (Array<kj::ArrayPtr<const_unsigned_char>_> *)&header);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
    Array<kj::ArrayPtr<const_unsigned_char>_>::~Array(&parts);
    Array<char>::~Array(&header.content);
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const byte> buffer) override {
    if (buffer == nullptr) return kj::READY_NOW;  // can't encode zero-size chunk since it indicates EOF.

    auto header = kj::str(kj::hex(buffer.size()), "\r\n");
    auto parts = kj::heapArray<ArrayPtr<const byte>>(3);
    parts[0] = header.asBytes();
    parts[1] = buffer;
    parts[2] = "\r\n"_kjb;

    auto promise = getInner().writeBodyData(parts.asPtr());
    return promise.attach(kj::mv(header), kj::mv(parts));
  }